

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x64IMUL(uchar *stream,x86Reg dst,x86Reg src)

{
  uchar uVar1;
  
  *stream = (8 < (int)dst) << 2 | 8 < (int)src | 0x48;
  stream[1] = '\x0f';
  stream[2] = 0xaf;
  uVar1 = encodeRegister(src,regCode[dst]);
  stream[3] = uVar1;
  return 4;
}

Assistant:

int x64IMUL(unsigned char *stream, x86Reg dst, x86Reg src)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, true, src, dst);
	*stream++ = 0x0f;
	*stream++ = 0xaf;
	*stream++ = encodeRegister(src, regCode[dst]);

	return int(stream - start);
}